

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnMemoryInit(SharedValidator *this,Location *loc,Var *segment_var)

{
  Result rhs;
  char *pcVar1;
  int __c;
  Var local_e0;
  Enum local_94;
  Var local_90;
  Enum local_44;
  undefined1 local_40 [8];
  MemoryType mt;
  Var *segment_var_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  mt.limits._16_8_ = segment_var;
  Result::Result((Result *)((long)&this_local + 4),Ok);
  MemoryType::MemoryType((MemoryType *)local_40);
  this->expr_loc_ = loc;
  Var::Var(&local_90,0,loc);
  local_44 = (Enum)CheckMemoryIndex(this,&local_90,(MemoryType *)local_40);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_44);
  Var::~Var(&local_90);
  Var::Var(&local_e0,segment_var);
  local_94 = (Enum)CheckDataSegmentIndex(this,&local_e0);
  pcVar1 = (char *)(ulong)local_94;
  Result::operator|=((Result *)((long)&this_local + 4),(Result)local_94);
  Var::~Var(&local_e0);
  pcVar1 = Var::index(segment_var,pcVar1,__c);
  rhs = TypeChecker::OnMemoryInit(&this->typechecker_,(uint32_t)pcVar1,(Limits *)local_40);
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnMemoryInit(const Location& loc, Var segment_var) {
  Result result = Result::Ok;
  MemoryType mt;
  expr_loc_ = &loc;
  result |= CheckMemoryIndex(Var(0, loc), &mt);
  result |= CheckDataSegmentIndex(segment_var);
  result |= typechecker_.OnMemoryInit(segment_var.index(), mt.limits);
  return result;
}